

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTests.cpp
# Opt level: O0

void globAndCheck(path *basePath,string_view pattern,GlobMode mode,GlobRank expectedRank,
                 error_code expectedEc,initializer_list<const_char_*> expected)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  bool bVar1;
  borrowed_iterator_t<slang::SmallVector<std::filesystem::__cxx11::path>_&> ppVar2;
  iterator ppVar3;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  AssertionHandler catchAssertionHandler_5;
  AssertionHandler catchAssertionHandler_4;
  path *path;
  iterator __end1_1;
  iterator __begin1_1;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *__range1_1;
  AssertionHandler catchAssertionHandler_3;
  borrowed_iterator_t<slang::SmallVector<std::filesystem::__cxx11::path>_&> it;
  char *str;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> *__range1;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  GlobRank rank;
  error_code ec;
  SmallVector<std::filesystem::__cxx11::path,_2UL> results;
  undefined1 *size;
  ITransientExpression *expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  undefined4 uVar4;
  AssertionHandler *in_stack_fffffffffffff9e0;
  undefined6 in_stack_fffffffffffff9e8;
  ExprLhs<bool> in_stack_fffffffffffff9ee;
  undefined1 in_stack_fffffffffffff9ef;
  AssertionHandler *in_stack_fffffffffffff9f0;
  undefined6 in_stack_fffffffffffff9f8;
  ExprLhs<bool> in_stack_fffffffffffff9fe;
  undefined1 in_stack_fffffffffffff9ff;
  error_code *in_stack_fffffffffffffa00;
  ExprLhs<slang::GlobRank_&> *in_stack_fffffffffffffa08;
  Flags resultDisposition;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffa10;
  byte local_591;
  AssertionHandler local_538;
  undefined1 local_4c9;
  StringRef local_4c8;
  error_code local_4b8;
  StringRef local_4a8;
  iterator local_450;
  iterator local_448;
  iterator local_440;
  SmallVectorBase<std::filesystem::__cxx11::path> *local_438;
  undefined8 local_428;
  undefined8 uStack_420;
  StringRef local_3f8;
  SourceLineInfo local_3e8;
  StringRef local_3d8;
  char *local_378;
  int local_370;
  borrowed_iterator_t<slang::SmallVector<std::filesystem::__cxx11::path>_&> local_368;
  char *local_360;
  const_iterator local_358;
  const_iterator local_350;
  initializer_list<const_char_*> *local_348;
  undefined1 local_338 [63];
  undefined1 in_stack_fffffffffffffd07;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *in_stack_fffffffffffffd08;
  undefined8 in_stack_fffffffffffffd10;
  GlobMode mode_00;
  path *in_stack_fffffffffffffd18;
  string_view in_stack_fffffffffffffd20;
  char *local_2c8;
  error_code *in_stack_fffffffffffffd40;
  SourceLineInfo local_2b0;
  StringRef local_2a0;
  undefined4 local_248;
  undefined8 local_240;
  unsigned_long local_230;
  StringRef local_1f8;
  SourceLineInfo local_1e8;
  StringRef local_1d8;
  GlobRank *local_178;
  StringRef local_140;
  SourceLineInfo local_130;
  StringRef local_120;
  undefined8 local_b8;
  undefined8 uStack_b0;
  GlobRank local_9c;
  undefined1 local_98 [16];
  SmallVectorBase<std::filesystem::__cxx11::path> local_88;
  int local_1c;
  undefined8 local_10;
  undefined8 uStack_8;
  
  mode_00 = (GlobMode)((ulong)in_stack_fffffffffffffd10 >> 0x20);
  local_1c = in_ECX;
  local_10 = in_RSI;
  uStack_8 = in_RDX;
  slang::SmallVector<std::filesystem::__cxx11::path,_2UL>::SmallVector
            ((SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x97d493);
  size = local_98;
  std::error_code::error_code((error_code *)in_stack_fffffffffffff9e0);
  local_b8 = local_10;
  uStack_b0 = uStack_8;
  local_9c = slang::svGlob(in_stack_fffffffffffffd18,in_stack_fffffffffffffd20,mode_00,
                           in_stack_fffffffffffffd08,(bool)in_stack_fffffffffffffd07,
                           in_stack_fffffffffffffd40);
  local_120 = operator____catch_sr((char *)in_stack_fffffffffffff9e0,(size_t)size);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_130,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/FileTests.cpp"
             ,0x67);
  local_140 = operator____catch_sr((char *)in_stack_fffffffffffff9e0,(size_t)size);
  expr = (ITransientExpression *)CONCAT44((int)((ulong)size >> 0x20),2);
  macroName.m_start._6_1_ = in_stack_fffffffffffff9fe.m_lhs;
  macroName.m_start._0_6_ = in_stack_fffffffffffff9f8;
  macroName.m_start._7_1_ = in_stack_fffffffffffff9ff;
  macroName.m_size = (size_type)in_stack_fffffffffffffa00;
  capturedExpression.m_start._6_1_ = in_stack_fffffffffffff9ee.m_lhs;
  capturedExpression.m_start._0_6_ = in_stack_fffffffffffff9e8;
  capturedExpression.m_start._7_1_ = in_stack_fffffffffffff9ef;
  capturedExpression.m_size = (size_type)in_stack_fffffffffffff9f0;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff9e0,macroName,(SourceLineInfo *)expr,capturedExpression,
             (Flags)in_stack_fffffffffffffa10);
  local_178 = (GlobRank *)
              Catch::operator<=<slang::GlobRank_&,_0>((Decomposer *)expr,(GlobRank *)0x97d5c7);
  Catch::operator==(in_stack_fffffffffffffa08,(GlobRank *)in_stack_fffffffffffffa00);
  Catch::AssertionHandler::handleExpr(in_stack_fffffffffffff9e0,expr);
  Catch::AssertionHandler::complete(in_stack_fffffffffffff9e0);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffff9e0);
  local_1d8 = operator____catch_sr((char *)in_stack_fffffffffffff9e0,(size_t)expr);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_1e8,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/FileTests.cpp"
             ,0x68);
  local_1f8 = operator____catch_sr((char *)in_stack_fffffffffffff9e0,(size_t)expr);
  value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44((int)((ulong)expr >> 0x20),2);
  macroName_00.m_start._6_1_ = in_stack_fffffffffffff9fe.m_lhs;
  macroName_00.m_start._0_6_ = in_stack_fffffffffffff9f8;
  macroName_00.m_start._7_1_ = in_stack_fffffffffffff9ff;
  macroName_00.m_size = (size_type)in_stack_fffffffffffffa00;
  capturedExpression_00.m_start._6_1_ = in_stack_fffffffffffff9ee.m_lhs;
  capturedExpression_00.m_start._0_6_ = in_stack_fffffffffffff9e8;
  capturedExpression_00.m_start._7_1_ = in_stack_fffffffffffff9ef;
  capturedExpression_00.m_size = (size_type)in_stack_fffffffffffff9f0;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff9e0,macroName_00,(SourceLineInfo *)value,capturedExpression_00,
             (Flags)in_stack_fffffffffffffa10);
  slang::SmallVectorBase<std::filesystem::__cxx11::path>::size(&local_88);
  local_230 = (unsigned_long)Catch::operator<=<unsigned_long,_0>((Decomposer *)value,0x97d74b);
  std::initializer_list<const_char_*>::size((initializer_list<const_char_*> *)&stack0x00000018);
  Catch::operator==((ExprLhs<unsigned_long> *)in_stack_fffffffffffffa08,
                    (unsigned_long)in_stack_fffffffffffffa00);
  Catch::AssertionHandler::handleExpr(in_stack_fffffffffffff9e0,(ITransientExpression *)value);
  Catch::AssertionHandler::complete(in_stack_fffffffffffff9e0);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffff9e0);
  bVar1 = std::operator==((error_code *)in_stack_fffffffffffff9f0,
                          (error_code *)
                          CONCAT17(in_stack_fffffffffffff9ef,
                                   CONCAT16(in_stack_fffffffffffff9ee.m_lhs,
                                            in_stack_fffffffffffff9e8)));
  local_591 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_248 = std::error_code::default_error_condition();
    local_240 = extraout_RDX;
    bVar1 = std::operator==(in_stack_fffffffffffffa00,
                            (error_condition *)
                            CONCAT17(in_stack_fffffffffffff9ff,
                                     CONCAT16(in_stack_fffffffffffff9fe.m_lhs,
                                              in_stack_fffffffffffff9f8)));
    local_591 = bVar1 ^ 0xff;
  }
  if ((local_591 & 1) != 0) {
    local_2a0 = operator____catch_sr((char *)in_stack_fffffffffffff9e0,(size_t)value);
    uVar4 = (undefined4)((ulong)value >> 0x20);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/FileTests.cpp"
               ,0x6b);
    local_2c8 = (char *)0x0;
    Catch::StringRef::StringRef((StringRef *)&local_2c8);
    value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar4,2);
    macroName_01.m_start._6_1_ = in_stack_fffffffffffff9fe.m_lhs;
    macroName_01.m_start._0_6_ = in_stack_fffffffffffff9f8;
    macroName_01.m_start._7_1_ = in_stack_fffffffffffff9ff;
    macroName_01.m_size = (size_type)in_stack_fffffffffffffa00;
    capturedExpression_01.m_start._6_1_ = in_stack_fffffffffffff9ee.m_lhs;
    capturedExpression_01.m_start._0_6_ = in_stack_fffffffffffff9e8;
    capturedExpression_01.m_start._7_1_ = in_stack_fffffffffffff9ef;
    capturedExpression_01.m_size = (size_type)in_stack_fffffffffffff9f0;
    Catch::AssertionHandler::AssertionHandler
              (in_stack_fffffffffffff9e0,macroName_01,(SourceLineInfo *)value,capturedExpression_01,
               (Flags)in_stack_fffffffffffffa10);
    Catch::MessageStream::MessageStream((MessageStream *)0x97d969);
    std::error_code::message_abi_cxx11_
              ((error_code *)
               CONCAT17(in_stack_fffffffffffff9ff,
                        CONCAT16(in_stack_fffffffffffff9fe.m_lhs,in_stack_fffffffffffff9f8)));
    Catch::MessageStream::operator<<((MessageStream *)in_stack_fffffffffffff9e0,value);
    Catch::MessageStream::operator<<((MessageStream *)in_stack_fffffffffffff9e0,(char (*) [5])value)
    ;
    std::error_code::message_abi_cxx11_
              ((error_code *)
               CONCAT17(in_stack_fffffffffffff9ff,
                        CONCAT16(in_stack_fffffffffffff9fe.m_lhs,in_stack_fffffffffffff9f8)));
    Catch::operator+(local_338);
    Catch::MessageStream::operator<<((MessageStream *)in_stack_fffffffffffff9e0,value);
    Catch::ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)value);
    Catch::AssertionHandler::handleMessage
              (in_stack_fffffffffffff9e0,(OfType)((ulong)value >> 0x20),(string *)0x97da2b);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9e0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9e0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9e0);
    Catch::MessageStream::~MessageStream((MessageStream *)0x97da61);
    Catch::AssertionHandler::complete(in_stack_fffffffffffff9e0);
    Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffff9e0);
  }
  local_348 = (initializer_list<const_char_*> *)&stack0x00000018;
  local_350 = std::initializer_list<const_char_*>::begin
                        ((initializer_list<const_char_*> *)&stack0x00000018);
  local_358 = std::initializer_list<const_char_*>::end
                        ((initializer_list<const_char_*> *)in_stack_fffffffffffff9e0);
  for (; local_350 != local_358; local_350 = local_350 + 1) {
    local_378 = *local_350;
    local_370 = local_1c;
    local_360 = local_378;
    ppVar2 = std::ranges::__find_if_fn::
             operator()<slang::SmallVector<std::filesystem::__cxx11::path,_2UL>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_tests_unittests_FileTests_cpp:110:49)>
                       ((__find_if_fn *)&std::ranges::find_if,&local_88,local_378,local_1c);
    local_368 = ppVar2;
    ppVar3 = slang::SmallVectorBase<std::filesystem::__cxx11::path>::end(&local_88);
    resultDisposition = (Flags)in_stack_fffffffffffffa10;
    if (ppVar2 == ppVar3) {
      local_3d8 = operator____catch_sr((char *)in_stack_fffffffffffff9e0,(size_t)value);
      uVar4 = (undefined4)((ulong)value >> 0x20);
      Catch::SourceLineInfo::SourceLineInfo
                (&local_3e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/FileTests.cpp"
                 ,0x73);
      local_3f8.m_start = (char *)0x0;
      local_3f8.m_size = 0;
      Catch::StringRef::StringRef(&local_3f8);
      value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar4,2)
      ;
      macroName_02.m_start._6_1_ = in_stack_fffffffffffff9fe.m_lhs;
      macroName_02.m_start._0_6_ = in_stack_fffffffffffff9f8;
      macroName_02.m_start._7_1_ = in_stack_fffffffffffff9ff;
      macroName_02.m_size = (size_type)in_stack_fffffffffffffa00;
      capturedExpression_02.m_start._6_1_ = in_stack_fffffffffffff9ee.m_lhs;
      capturedExpression_02.m_start._0_6_ = in_stack_fffffffffffff9e8;
      capturedExpression_02.m_start._7_1_ = in_stack_fffffffffffff9ef;
      capturedExpression_02.m_size = (size_type)in_stack_fffffffffffff9f0;
      Catch::AssertionHandler::AssertionHandler
                (in_stack_fffffffffffff9e0,macroName_02,(SourceLineInfo *)value,
                 capturedExpression_02,resultDisposition);
      local_428 = 0;
      uStack_420 = 0;
      Catch::MessageStream::MessageStream((MessageStream *)0x97dd0f);
      Catch::MessageStream::operator<<((MessageStream *)in_stack_fffffffffffff9e0,(char **)value);
      Catch::MessageStream::operator<<
                ((MessageStream *)in_stack_fffffffffffff9e0,(char (*) [30])value);
      in_stack_fffffffffffffa10 = Catch::operator+(&local_10);
      Catch::MessageStream::operator<<
                ((MessageStream *)in_stack_fffffffffffff9e0,
                 (basic_string_view<char,_std::char_traits<char>_> *)value);
      Catch::ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)value);
      Catch::AssertionHandler::handleMessage
                (in_stack_fffffffffffff9e0,(OfType)((ulong)value >> 0x20),(string *)0x97dd9d);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9e0);
      Catch::MessageStream::~MessageStream((MessageStream *)0x97ddb9);
      Catch::AssertionHandler::complete(in_stack_fffffffffffff9e0);
      Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffff9e0);
    }
  }
  local_438 = &local_88;
  local_440 = slang::SmallVectorBase<std::filesystem::__cxx11::path>::begin(local_438);
  local_448 = slang::SmallVectorBase<std::filesystem::__cxx11::path>::end(local_438);
  for (; local_440 != local_448; local_440 = local_440 + 1) {
    local_450 = local_440;
    if (local_1c == 0) {
      local_4a8 = operator____catch_sr((char *)in_stack_fffffffffffff9e0,(size_t)value);
      in_stack_fffffffffffffa00 = &local_4b8;
      Catch::SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)in_stack_fffffffffffffa00,
                 "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/FileTests.cpp"
                 ,0x79);
      local_4c8 = operator____catch_sr((char *)in_stack_fffffffffffff9e0,(size_t)value);
      value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44((int)((ulong)value >> 0x20),2);
      macroName_03.m_start._6_1_ = in_stack_fffffffffffff9fe.m_lhs;
      macroName_03.m_start._0_6_ = in_stack_fffffffffffff9f8;
      macroName_03.m_start._7_1_ = in_stack_fffffffffffff9ff;
      macroName_03.m_size = (size_type)in_stack_fffffffffffffa00;
      capturedExpression_03.m_start._6_1_ = in_stack_fffffffffffff9ee.m_lhs;
      capturedExpression_03.m_start._0_6_ = in_stack_fffffffffffff9e8;
      capturedExpression_03.m_start._7_1_ = in_stack_fffffffffffff9ef;
      capturedExpression_03.m_size = (size_type)in_stack_fffffffffffff9f0;
      Catch::AssertionHandler::AssertionHandler
                (in_stack_fffffffffffff9e0,macroName_03,(SourceLineInfo *)value,
                 capturedExpression_03,(Flags)in_stack_fffffffffffffa10);
      in_stack_fffffffffffff9ff =
           std::filesystem::is_regular_file((path *)in_stack_fffffffffffff9e0);
      in_stack_fffffffffffff9fe = Catch::operator<=<bool,_0>((Decomposer *)value,false);
      local_4c9 = in_stack_fffffffffffff9fe;
      Catch::AssertionHandler::handleExpr<bool>
                (in_stack_fffffffffffff9f0,
                 (ExprLhs<bool> *)
                 CONCAT17(in_stack_fffffffffffff9ef,
                          CONCAT16(in_stack_fffffffffffff9ee.m_lhs,in_stack_fffffffffffff9e8)));
      Catch::AssertionHandler::complete(in_stack_fffffffffffff9e0);
      Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffff9e0);
    }
    else {
      local_538.m_assertionInfo.lineInfo =
           (SourceLineInfo)operator____catch_sr((char *)in_stack_fffffffffffff9e0,(size_t)value);
      in_stack_fffffffffffff9f0 = &local_538;
      Catch::SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)in_stack_fffffffffffff9f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/FileTests.cpp"
                 ,0x7b);
      operator____catch_sr((char *)in_stack_fffffffffffff9e0,(size_t)value);
      value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44((int)((ulong)value >> 0x20),2);
      macroName_04.m_start._6_1_ = in_stack_fffffffffffff9fe.m_lhs;
      macroName_04.m_start._0_6_ = in_stack_fffffffffffff9f8;
      macroName_04.m_start._7_1_ = in_stack_fffffffffffff9ff;
      macroName_04.m_size = (size_type)in_stack_fffffffffffffa00;
      capturedExpression_04.m_start._6_1_ = in_stack_fffffffffffff9ee.m_lhs;
      capturedExpression_04.m_start._0_6_ = in_stack_fffffffffffff9e8;
      capturedExpression_04.m_start._7_1_ = in_stack_fffffffffffff9ef;
      capturedExpression_04.m_size = (size_type)in_stack_fffffffffffff9f0;
      Catch::AssertionHandler::AssertionHandler
                (in_stack_fffffffffffff9e0,macroName_04,(SourceLineInfo *)value,
                 capturedExpression_04,(Flags)in_stack_fffffffffffffa10);
      in_stack_fffffffffffff9ef = std::filesystem::is_directory((path *)in_stack_fffffffffffff9e0);
      in_stack_fffffffffffff9ee = Catch::operator<=<bool,_0>((Decomposer *)value,false);
      Catch::AssertionHandler::handleExpr<bool>
                (in_stack_fffffffffffff9f0,
                 (ExprLhs<bool> *)
                 CONCAT17(in_stack_fffffffffffff9ef,
                          CONCAT16(in_stack_fffffffffffff9ee.m_lhs,in_stack_fffffffffffff9e8)));
      Catch::AssertionHandler::complete(in_stack_fffffffffffff9e0);
      Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffff9e0);
    }
  }
  slang::SmallVector<std::filesystem::__cxx11::path,_2UL>::~SmallVector
            ((SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x97e218);
  return;
}

Assistant:

static void globAndCheck(const fs::path& basePath, std::string_view pattern, GlobMode mode,
                         GlobRank expectedRank, std::error_code expectedEc,
                         std::initializer_list<const char*> expected) {
    SmallVector<fs::path> results;
    std::error_code ec;
    auto rank = svGlob(basePath, pattern, mode, results, /* expandEnvVars */ true, ec);

    CHECK(rank == expectedRank);
    CHECK(results.size() == expected.size());

    if (ec != expectedEc && ec.default_error_condition() != expectedEc)
        FAIL_CHECK(ec.message() << " != " << expectedEc.message());

    for (auto str : expected) {
        auto it = std::ranges::find_if(results, [str, mode](auto& item) {
            return item.has_filename() ? item.filename() == str
                                       : item.parent_path().filename() == str;
        });
        if (it == results.end()) {
            FAIL_CHECK(str << " is not found in results for " << pattern);
        }
    }

    for (auto& path : results) {
        if (mode == GlobMode::Files)
            CHECK(fs::is_regular_file(path));
        else
            CHECK(fs::is_directory(path));
    }
}